

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

U32 duckdb_zstd::ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t *ms,BYTE *ip)

{
  U32 *pUVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  char cVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  
  pUVar1 = ms->hashTable;
  uVar5 = (ms->cParams).chainLog;
  pUVar2 = ms->chainTable;
  pBVar3 = (ms->window).base;
  cVar4 = (char)(ms->cParams).hashLog;
  bVar6 = 0x40 - cVar4;
  bVar7 = 0x20 - cVar4;
  iVar10 = (ms->cParams).minMatch - 5;
  lVar11 = -0x30e4432345000000;
  for (uVar8 = (ulong)ms->nextToUpdate; uVar8 < ((long)ip - (long)pBVar3 & 0xffffffffU);
      uVar8 = uVar8 + 1) {
    switch(iVar10) {
    case 0:
      uVar9 = *(long *)(pBVar3 + uVar8) * -0x30e4432345000000;
      break;
    case 1:
      uVar9 = *(long *)(pBVar3 + uVar8) * -0x30e4432340650000;
      break;
    case 2:
      uVar9 = *(long *)(pBVar3 + uVar8) * -0x30e44323405a9d00;
      break;
    case 3:
      uVar9 = *(long *)(pBVar3 + uVar8) * -0x30e44323485a9b9d;
      break;
    default:
      uVar9 = (ulong)((uint)(*(int *)(pBVar3 + uVar8) * -0x61c8864f) >> (bVar7 & 0x1f));
      goto LAB_01f675ca;
    }
    uVar9 = uVar9 >> (bVar6 & 0x3f);
LAB_01f675ca:
    pUVar2[(uint)uVar8 & ~(-1 << ((byte)uVar5 & 0x1f))] = pUVar1[uVar9];
    pUVar1[uVar9] = (uint)uVar8;
  }
  ms->nextToUpdate = (U32)((long)ip - (long)pBVar3);
  switch(iVar10) {
  case 0:
    break;
  case 1:
    lVar11 = -0x30e4432340650000;
    break;
  case 2:
    lVar11 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar8 = (ulong)(*(long *)ip * -0x30e44323485a9b9d) >> (bVar6 & 0x3f);
    goto LAB_01f6765e;
  default:
    uVar8 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (bVar7 & 0x1f));
    goto LAB_01f6765e;
  }
  uVar8 = (ulong)(lVar11 * *(long *)ip) >> (bVar6 & 0x3f);
LAB_01f6765e:
  return pUVar1[uVar8];
}

Assistant:

U32 ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t* ms, const BYTE* ip) {
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    return ZSTD_insertAndFindFirstIndex_internal(ms, cParams, ip, ms->cParams.minMatch, /* lazySkipping*/ 0);
}